

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<int>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,tst_future::finallyRejected()::__1,MyException_const&>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,anon_class_8_1_a7dec128 fn
               ,MyException *args)

{
  int local_2c;
  MyException *local_28;
  MyException *args_local;
  QPromiseReject<int> *reject_local;
  QPromiseResolve<int> *resolve_local;
  anon_class_8_1_a7dec128 fn_local;
  
  local_28 = args;
  args_local = (MyException *)reject;
  reject_local = (QPromiseReject<int> *)resolve;
  resolve_local = (QPromiseResolve<int> *)fn.error;
  local_2c = tst_future::finallyRejected::anon_class_8_1_a7dec128::operator()
                       ((anon_class_8_1_a7dec128 *)&resolve_local,args);
  PromiseFulfill<int>::call<int,QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_2c,(QPromiseResolve<int> *)reject_local,(QPromiseReject<int> *)args_local);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }